

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5PoslistNext64(u8 *a,int n,int *pi,i64 *piOff)

{
  int iVar1;
  undefined4 in_EAX;
  int iVar2;
  int iVar3;
  ulong uVar4;
  int iVal;
  undefined8 uStack_38;
  
  iVar3 = *pi;
  if (iVar3 < n) {
    uVar4 = *piOff;
    uStack_38 = (ulong)CONCAT14(a[iVar3],in_EAX);
    iVar2 = 1;
    if ((char)a[iVar3] < '\0') {
      iVar2 = sqlite3Fts5GetVarint32(a + iVar3,(u32 *)((long)&uStack_38 + 4));
    }
    iVar3 = iVar3 + iVar2;
    if (uStack_38._4_4_ == 1) {
      uStack_38 = (ulong)CONCAT14(a[iVar3],(undefined4)uStack_38);
      iVar2 = 1;
      if ((char)a[iVar3] < '\0') {
        iVar2 = sqlite3Fts5GetVarint32(a + iVar3,(u32 *)((long)&uStack_38 + 4));
      }
      iVar1 = iVar2 + iVar3;
      uVar4 = uStack_38 & 0xffffffff00000000;
      uStack_38 = (ulong)CONCAT14(a[iVar1],(undefined4)uStack_38);
      if ((char)a[iVar1] < '\0') {
        iVar3 = sqlite3Fts5GetVarint32(a + iVar1,(u32 *)((long)&uStack_38 + 4));
        iVar3 = iVar1 + iVar3;
      }
      else {
        iVar3 = iVar3 + iVar2 + 1;
      }
    }
    *piOff = (uStack_38._4_4_ + 0x7ffffffeU & 0x7fffffff) + uVar4;
    *pi = iVar3;
    iVar3 = 0;
  }
  else {
    *piOff = -1;
    iVar3 = 1;
  }
  return iVar3;
}

Assistant:

static int sqlite3Fts5PoslistNext64(
  const u8 *a, int n,             /* Buffer containing poslist */
  int *pi,                        /* IN/OUT: Offset within a[] */
  i64 *piOff                      /* IN/OUT: Current offset */
){
  int i = *pi;
  if( i>=n ){
    /* EOF */
    *piOff = -1;
    return 1;  
  }else{
    i64 iOff = *piOff;
    int iVal;
    fts5FastGetVarint32(a, i, iVal);
    if( iVal==1 ){
      fts5FastGetVarint32(a, i, iVal);
      iOff = ((i64)iVal) << 32;
      fts5FastGetVarint32(a, i, iVal);
    }
    *piOff = iOff + ((iVal-2) & 0x7FFFFFFF);
    *pi = i;
    return 0;
  }
}